

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshTFaceListBlock
          (Parser *this,uint iNumFaces,Mesh *mesh,uint iChannel)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  uint local_38;
  uint local_34;
  uint iIndex;
  uint aiValues [3];
  int iDepth;
  uint iChannel_local;
  Mesh *mesh_local;
  uint iNumFaces_local;
  Parser *this_local;
  
  aiValues[1] = 0;
  aiValues[2] = iChannel;
  do {
    while (*this->filePtr != '*') {
LAB_00630643:
      if (*this->filePtr == '{') {
        aiValues[1] = aiValues[1] + 1;
      }
      else if (*this->filePtr == '}') {
        aiValues[1] = aiValues[1] - 1;
        if (aiValues[1] == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_TFACE_LIST chunk (Level 3)")
        ;
      }
      bVar3 = IsLineEnd<char>(*this->filePtr);
      if ((bVar3) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar3 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACE",10);
    if (!bVar3) goto LAB_00630643;
    local_38 = 0;
    ParseLV4MeshLongTriple(this,&local_34,&local_38);
    if ((local_38 < iNumFaces) &&
       (uVar4 = (ulong)local_38,
       sVar5 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces),
       uVar1 = local_34, uVar4 < sVar5)) {
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                          (ulong)local_38);
      uVar2 = iIndex;
      pvVar6->amUVIndices[aiValues[2]][0] = uVar1;
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                          (ulong)local_38);
      uVar1 = aiValues[0];
      pvVar6->amUVIndices[aiValues[2]][1] = uVar2;
      pvVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::operator[]
                         (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces,
                          (ulong)local_38);
      pvVar6->amUVIndices[aiValues[2]][2] = uVar1;
    }
    else {
      LogWarning(this,"UV-Face has an invalid index. It will be ignored");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshTFaceListBlock(unsigned int iNumFaces,
    ASE::Mesh& mesh, unsigned int iChannel)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_TFACE" ,10))
            {
                unsigned int aiValues[3];
                unsigned int iIndex = 0;

                ParseLV4MeshLongTriple(aiValues,iIndex);
                if (iIndex >= iNumFaces || iIndex >= mesh.mFaces.size())
                {
                    LogWarning("UV-Face has an invalid index. It will be ignored");
                }
                else
                {
                    // copy UV indices
                    mesh.mFaces[iIndex].amUVIndices[iChannel][0] = aiValues[0];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][1] = aiValues[1];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][2] = aiValues[2];
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_TFACE_LIST");
    }
    return;
}